

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O1

Vec3fa __thiscall embree::Geometry::computeDirection(Geometry *this,uint primID)

{
  undefined8 *puVar1;
  undefined4 in_register_00000034;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30,CONCAT44(in_register_00000034,primID));
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"computeDirection not implemented for this geometry","");
  *puVar1 = &PTR__rtcore_error_022018b0;
  *(undefined4 *)(puVar1 + 1) = 3;
  puVar1[2] = puVar1 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_40,local_40 + local_38);
  __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

virtual Vec3fa computeDirection(unsigned int primID) const {
      throw_RTCError(RTC_ERROR_INVALID_OPERATION,"computeDirection not implemented for this geometry"); 
    }